

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O3

void __thiscall hdc::SourceFile::addClass(SourceFile *this,Class *klass)

{
  pointer *pppCVar1;
  iterator __position;
  Class *local_18;
  
  __position._M_current =
       (this->classes).super__Vector_base<hdc::Class_*,_std::allocator<hdc::Class_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = klass;
  if (__position._M_current ==
      (this->classes).super__Vector_base<hdc::Class_*,_std::allocator<hdc::Class_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::Class*,std::allocator<hdc::Class*>>::_M_realloc_insert<hdc::Class*const&>
              ((vector<hdc::Class*,std::allocator<hdc::Class*>> *)&this->classes,__position,
               &local_18);
  }
  else {
    *__position._M_current = klass;
    pppCVar1 = &(this->classes).super__Vector_base<hdc::Class_*,_std::allocator<hdc::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  Class::setSourceFile(local_18,this);
  ASTNode::setParentNode(&local_18->super_ASTNode,&this->super_ASTNode);
  return;
}

Assistant:

void SourceFile::addClass(Class* klass) {
    classes.push_back(klass);
    klass->setSourceFile(this);
    klass->setParentNode(this);
}